

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
::copy_elements_array_from(void)

{
  size_t num_constructed;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  *in_stack_ffffffffffffffa0;
  anon_class_24_3_00b41a18 in_stack_ffffffffffffffb0;
  
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
  ::
  for_all_elements<boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>::copy_elements_array_from(boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>const&,std::integral_constant<bool,false>)::_lambda(std::pair<std::type_index_const,std::any>const*)_1_>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void copy_elements_array_from(const table_core& x, std::false_type /* -> manual */) {
        std::size_t num_constructed = 0;
        BOOST_TRY {
            x.for_all_elements([&, this](const element_type* p) {
                construct_element(arrays.elements() + (p - x.arrays.elements()), *p);
                ++num_constructed;
            });
        }